

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_aligned.cc
# Opt level: O2

void runOnce<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy>(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  long *plVar5;
  ulong *puVar6;
  ostream *poVar7;
  Sequence *pSVar8;
  atomic<long> *paVar9;
  ulong uVar10;
  ulong uVar11;
  int i_3;
  ulong uVar12;
  ulong uVar13;
  thread *ptVar14;
  Sequence *pSVar15;
  int i_1;
  int i_2;
  int i;
  long lVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> seqs;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64> s;
  _Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> local_380;
  undefined8 local_368;
  long *local_360;
  thread *local_358;
  ulong *local_350;
  string local_348;
  string local_328;
  reference_wrapper<disruptor::Sequence> local_308;
  Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64> local_300;
  
  poVar7 = std::operator<<((ostream *)&std::cout,"Staring run ");
  std::endl<char,std::char_traits<char>>(poVar7);
  LOCK();
  sum.super___atomic_base<long>._M_i = (__atomic_base<long>)0;
  UNLOCK();
  uVar12 = (ulong)nc;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar12;
  uVar10 = 0xffffffffffffffff;
  uVar11 = SUB168(auVar2 * ZEXT816(0x78),0);
  if (SUB168(auVar2 * ZEXT816(0x78),8) != 0) {
    uVar11 = uVar10;
  }
  pSVar8 = (Sequence *)operator_new__(uVar11);
  auVar3 = _DAT_0012c020;
  auVar2 = _DAT_0012c010;
  if (uVar12 != 0) {
    uVar11 = 0;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar12 * 0x78 - 0x78;
    auVar1 = auVar1 / ZEXT816(0x78);
    auVar17._8_4_ = auVar1._0_4_;
    auVar17._0_8_ = auVar1._0_8_;
    auVar17._12_4_ = auVar1._4_4_;
    paVar9 = &pSVar8[1].sequence_;
    auVar17 = auVar17 ^ _DAT_0012c020;
    do {
      auVar18._8_4_ = (int)uVar11;
      auVar18._0_8_ = uVar11;
      auVar18._12_4_ = (int)(uVar11 >> 0x20);
      auVar18 = (auVar18 | auVar2) ^ auVar3;
      if ((bool)(~(auVar18._4_4_ == auVar17._4_4_ && auVar17._0_4_ < auVar18._0_4_ ||
                  auVar17._4_4_ < auVar18._4_4_) & 1)) {
        paVar9[-0xf] = (__atomic_base<long>)0xffffffffffffffff;
      }
      if ((auVar18._12_4_ != auVar17._12_4_ || auVar18._8_4_ <= auVar17._8_4_) &&
          auVar18._12_4_ <= auVar17._12_4_) {
        (paVar9->super___atomic_base<long>)._M_i = -1;
      }
      uVar11 = uVar11 + 2;
      paVar9 = paVar9 + 0x1e;
    } while ((auVar1._0_8_ + 2U & 0x7fffffffffffffe) != uVar11);
  }
  local_380._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_380._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_380._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>::
  Sequencer(&local_300,RING_BUFFER_SIZE);
  pSVar15 = pSVar8;
  for (lVar16 = 0; lVar16 < nc; lVar16 = lVar16 + 1) {
    local_328._M_dataplus._M_p = (pointer)pSVar15;
    std::vector<disruptor::Sequence*,std::allocator<disruptor::Sequence*>>::
    emplace_back<disruptor::Sequence*>
              ((vector<disruptor::Sequence*,std::allocator<disruptor::Sequence*>> *)&local_380,
               (Sequence **)&local_328);
    pSVar15 = pSVar15 + 1;
  }
  std::vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::operator=
            (&local_300.gating_sequences_,
             (vector<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_> *)&local_380);
  iVar4 = nc;
  uVar13 = (ulong)nc;
  uVar11 = uVar13 * 8;
  uVar12 = uVar11 + 8;
  if (0xfffffffffffffff7 < uVar11) {
    uVar12 = uVar10;
  }
  if ((long)uVar13 < 0) {
    uVar12 = uVar10;
  }
  local_350 = (ulong *)operator_new__(uVar12);
  *local_350 = uVar13;
  ptVar14 = (thread *)(local_350 + 1);
  if (iVar4 != 0) {
    memset(ptVar14,0,uVar11);
  }
  pSVar15 = pSVar8;
  local_358 = ptVar14;
  for (lVar16 = 0; iVar4 = np, lVar16 < (int)uVar13; lVar16 = lVar16 + 1) {
    local_348._M_dataplus._M_p = (pointer)&local_300;
    local_308._M_data = pSVar15;
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>&,disruptor::Sequence&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>>,std::reference_wrapper<disruptor::Sequence>,void>
              ((thread *)&local_328,
               consume<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy>,
               (reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>_>
                *)&local_348,&local_308);
    std::thread::operator=(ptVar14,(thread *)&local_328);
    std::thread::~thread((thread *)&local_328);
    uVar13 = (ulong)(uint)nc;
    ptVar14 = ptVar14 + 1;
    pSVar15 = pSVar15 + 1;
  }
  lVar16 = (long)np;
  uVar10 = lVar16 * 8;
  uVar11 = uVar10 + 8;
  if (0xfffffffffffffff7 < uVar10) {
    uVar11 = 0xffffffffffffffff;
  }
  if (lVar16 < 0) {
    uVar11 = 0xffffffffffffffff;
  }
  local_360 = (long *)operator_new__(uVar11);
  *local_360 = lVar16;
  ptVar14 = (thread *)(local_360 + 1);
  if (iVar4 != 0) {
    memset(ptVar14,0,uVar10);
  }
  local_368 = std::chrono::_V2::system_clock::now();
  for (lVar16 = 0; puVar6 = local_350, plVar5 = local_360, uVar10 = (ulong)np, lVar16 < (long)uVar10
      ; lVar16 = lVar16 + 1) {
    local_348._M_dataplus._M_p = (pointer)&local_300;
    std::thread::
    thread<void(&)(disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>&),std::reference_wrapper<disruptor::Sequencer<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy,64>>,void>
              ((thread *)&local_328,
               produce<long,disruptor::MultiThreadedStrategy,disruptor::BlockingStrategy>,
               (reference_wrapper<disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>_>
                *)&local_348);
    std::thread::operator=(ptVar14,(thread *)&local_328);
    std::thread::~thread((thread *)&local_328);
    ptVar14 = ptVar14 + 1;
  }
  for (lVar16 = 0; lVar16 < (int)uVar10; lVar16 = lVar16 + 1) {
    std::thread::join();
    uVar10 = (ulong)(uint)np;
  }
  for (lVar16 = 0; lVar16 < nc; lVar16 = lVar16 + 1) {
    std::thread::join();
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"\nBatch size: ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  poVar7 = std::operator<<(poVar7," Ring buffer size: ");
  poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
  poVar7 = std::operator<<(poVar7," Alignment: ");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0x40);
  std::operator<<(poVar7,'\n');
  poVar7 = std::operator<<((ostream *)&std::cout,"Cursor: ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  std::operator<<(poVar7,'\n');
  poVar7 = std::operator<<((ostream *)&std::cout,"Sum: ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  poVar7 = std::operator<<(poVar7," Expected sum: ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  std::operator<<(poVar7,'\n');
  std::chrono::_V2::system_clock::now();
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,np);
  poVar7 = std::operator<<(poVar7,"P-");
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,nc);
  poVar7 = std::operator<<(poVar7,"C ");
  demangle_abi_cxx11_(&local_328,"N9disruptor21MultiThreadedStrategyE");
  poVar7 = std::operator<<(poVar7,(string *)&local_328);
  poVar7 = std::operator<<(poVar7," ");
  demangle_abi_cxx11_(&local_348,"N9disruptor16BlockingStrategyE");
  poVar7 = std::operator<<(poVar7,(string *)&local_348);
  std::operator<<(poVar7,'\n');
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&local_328);
  poVar7 = std::ostream::_M_insert<long>((long)&std::cout);
  poVar7 = std::operator<<(poVar7," ops/secs");
  std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<((ostream *)&std::cout,"Milliseconds: ");
  poVar7 = std::ostream::_M_insert<long>((long)poVar7);
  std::operator<<(poVar7,"\n\n");
  if (*puVar6 != 0) {
    lVar16 = *puVar6 << 3;
    do {
      std::thread::~thread((thread *)((long)puVar6 + lVar16));
      lVar16 = lVar16 + -8;
    } while (lVar16 != 0);
  }
  operator_delete__(puVar6);
  if (*plVar5 != 0) {
    lVar16 = *plVar5 << 3;
    do {
      std::thread::~thread((thread *)((long)plVar5 + lVar16));
      lVar16 = lVar16 + -8;
    } while (lVar16 != 0);
  }
  operator_delete__(plVar5);
  operator_delete__(pSVar8);
  disruptor::Sequencer<long,_disruptor::MultiThreadedStrategy,_disruptor::BlockingStrategy,_64>::
  ~Sequencer(&local_300);
  std::_Vector_base<disruptor::Sequence_*,_std::allocator<disruptor::Sequence_*>_>::~_Vector_base
            (&local_380);
  return;
}

Assistant:

void runOnce() {
  std::cout << "Staring run " << std::endl;

  sum.store(0);

  disruptor::Sequence* sequences = new disruptor::Sequence[nc];

  std::vector<disruptor::Sequence*> seqs;
  disruptor::Sequencer<T, C, W, Alignment> s(RING_BUFFER_SIZE);

  for (int i = 0; i < nc; ++i) seqs.push_back(&sequences[i]);

  s.set_gating_sequences(seqs);

  std::thread* tc = new std::thread[nc];
  for (int i = 0; i < nc; ++i)
    tc[i] = std::thread(consume<T, C, W>, std::ref(s), std::ref(sequences[i]));

  std::thread* tp = new std::thread[np];

  auto start_time = std::chrono::high_resolution_clock::now();

  for (int i = 0; i < np; ++i)
    tp[i] = std::thread(produce<T, C, W>, std::ref(s));

  // std::this_thread::sleep_for(std::chrono::seconds(3));

  for (int i = 0; i < np; ++i) tp[i].join();
  for (int i = 0; i < nc; ++i) tc[i].join();

  int64_t cursor = s.GetCursor();
  std::cout << "\nBatch size: " << delta
            << " Ring buffer size: " << RING_BUFFER_SIZE
            << " Alignment: " << Alignment << '\n';
  std::cout << "Cursor: " << cursor << '\n';
  std::cout << "Sum: " << sum.load() << " Expected sum: "
            << (expectedValue * (expectedValue + 1) * nc) / 2 << '\n';

  auto end_time = std::chrono::high_resolution_clock::now();
  auto diff = end_time - start_time;

  // std::cout.precision(15);
  std::cout << np << "P-" << nc << "C " << demangle(typeid(C).name()) << " "
            << demangle(typeid(W).name()) << '\n';
  std::cout << (cursor * 1000) /
                   (std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                        .count())
            << " ops/secs"
            << "\n";

  std::cout << "Milliseconds: " << std::chrono::duration_cast<std::chrono::milliseconds>(diff)
                          .count() << "\n\n";

  delete[] tc;
  delete[] tp;
  delete[] sequences;
}